

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-opt64.c
# Opt level: O0

void KeccakP1600_AddBytesInLane(void *state,uint lanePosition,uchar *data,uint offset,uint length)

{
  int in_ECX;
  byte *in_RDX;
  uint in_ESI;
  long in_RDI;
  uint in_R8D;
  uint64_t lane;
  ulong local_28;
  int local_1c;
  uint local_c;
  long local_8;
  
  if (in_R8D != 0) {
    local_1c = in_ECX;
    local_c = in_ESI;
    local_8 = in_RDI;
    if (in_R8D == 1) {
      local_28 = (ulong)*in_RDX;
    }
    else {
      local_28 = 0;
      memcpy(&local_28,in_RDX,(ulong)in_R8D);
    }
    *(ulong *)(local_8 + (ulong)local_c * 8) =
         local_28 << ((byte)(local_1c << 3) & 0x3f) ^ *(ulong *)(local_8 + (ulong)local_c * 8);
  }
  return;
}

Assistant:

void KeccakP1600_AddBytesInLane(void *state, unsigned int lanePosition, const unsigned char *data, unsigned int offset, unsigned int length)
{
#if (PLATFORM_BYTE_ORDER == IS_LITTLE_ENDIAN)
    uint64_t lane;
    if (length == 0)
        return;
    if (length == 1)
        lane = data[0];
    else {
        lane = 0;
        memcpy(&lane, data, length);
    }
    lane <<= offset*8;
#else
    uint64_t lane = 0;
    unsigned int i;
    for(i=0; i<length; i++)
        lane |= ((uint64_t)data[i]) << ((i+offset)*8);
#endif
    ((uint64_t*)state)[lanePosition] ^= lane;
}